

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_decode_huffman_tree(huffman *hf,uint rbits,wchar_t c)

{
  ushort uVar1;
  wchar_t wVar2;
  wchar_t local_2c;
  wchar_t extlen;
  htree_t *ht;
  wchar_t c_local;
  uint rbits_local;
  huffman *hf_local;
  
  local_2c = hf->shift_bits;
  ht._0_4_ = c;
  while( true ) {
    if ((wchar_t)ht < hf->len_size) {
      return (wchar_t)ht;
    }
    wVar2 = (wchar_t)ht - hf->len_size;
    if ((local_2c < L'\x01') || (hf->tree_used <= wVar2)) break;
    if ((rbits & 1 << ((byte)(local_2c + L'\xffffffff') & 0x1f)) == 0) {
      uVar1 = hf->tree[wVar2].right;
    }
    else {
      uVar1 = hf->tree[wVar2].left;
    }
    ht._0_4_ = (wchar_t)uVar1;
    local_2c = local_2c + L'\xffffffff';
  }
  return L'\0';
}

Assistant:

static int
lzx_decode_huffman_tree(struct huffman *hf, unsigned rbits, int c)
{
	struct htree_t *ht;
	int extlen;

	ht = hf->tree;
	extlen = hf->shift_bits;
	while (c >= hf->len_size) {
		c -= hf->len_size;
		if (extlen-- <= 0 || c >= hf->tree_used)
			return (0);
		if (rbits & (1U << extlen))
			c = ht[c].left;
		else
			c = ht[c].right;
	}
	return (c);
}